

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht.c
# Opt level: O1

int ht_set(lgx_ht_t *ht,lgx_ht_node_t *node)

{
  lgx_ht_node_t **pplVar1;
  ulong uVar2;
  int iVar3;
  lgx_ht_node_s **pplVar4;
  lgx_ht_node_t *plVar5;
  
  uVar2 = (ulong)node->hash % (ulong)ht->size;
  pplVar1 = ht->table;
  plVar5 = pplVar1[uVar2];
  if (plVar5 == (lgx_ht_node_t *)0x0) {
    node->next = (lgx_ht_node_s *)0x0;
    pplVar1[uVar2] = node;
  }
  else {
    iVar3 = lgx_str_cmp(&node->k,&plVar5->k);
    if (iVar3 == 0) {
      return 1;
    }
    do {
      plVar5 = plVar5->next;
      if (plVar5 == (lgx_ht_node_s *)0x0) {
        pplVar1 = ht->table;
        node->next = pplVar1[uVar2];
        pplVar1[uVar2] = node;
        break;
      }
      iVar3 = lgx_str_cmp(&node->k,&plVar5->k);
    } while (iVar3 != 0);
    if (plVar5 != (lgx_ht_node_s *)0x0) {
      return 1;
    }
  }
  ht->length = ht->length + 1;
  pplVar4 = &ht->tail->order;
  if (ht->tail == (lgx_ht_node_t *)0x0) {
    pplVar4 = &ht->head;
  }
  *pplVar4 = node;
  ht->tail = node;
  return 0;
}

Assistant:

static int ht_set(lgx_ht_t* ht, lgx_ht_node_t* node) {
    unsigned pos = node->hash % ht->size;

    // 插入位置是空的
    if (!ht->table[pos]) {
        node->next = NULL;
        ht->table[pos] = node;
    } else {
        lgx_ht_node_t* next = ht->table[pos];
        while (next) {
            if (lgx_str_cmp(&node->k, &next->k) == 0) {
                // 键已存在
                return 1;
            }
            next = next->next;
        }

        // 插入到链表头部
        node->next = ht->table[pos];
        ht->table[pos] = node;
    }

    ++ ht->length;

    if (!ht->tail) {
        ht->head = node;
        ht->tail = node;
    } else {
        ht->tail->order = node;
        ht->tail = node;
    }

    return 0;
}